

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int parse_long_options(char **nargv,char *options,option *long_options,int *idx,int short_too)

{
  char *__s;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int local_58;
  int local_54;
  int match;
  int i;
  size_t current_argv_len;
  char *has_equal;
  char *current_argv;
  int short_too_local;
  int *idx_local;
  option *long_options_local;
  char *options_local;
  char **nargv_local;
  
  __s = place;
  local_58 = -1;
  optind = optind + 1;
  pcVar2 = strchr(place,0x3d);
  if (pcVar2 == (char *)0x0) {
    _match = strlen(__s);
    current_argv_len = 0;
  }
  else {
    _match = (long)pcVar2 - (long)__s;
    current_argv_len = (size_t)(pcVar2 + 1);
  }
  local_54 = 0;
  do {
    if (long_options[local_54].name == (char *)0x0) {
LAB_0010aa9d:
      if (local_58 == -1) {
        if (short_too == 0) {
          if ((opterr != 0) && (*options != ':')) {
            warnx("unknown option -- %s",__s);
          }
          optopt = 0;
          nargv_local._4_4_ = 0x3f;
        }
        else {
          optind = optind + -1;
          nargv_local._4_4_ = -1;
        }
      }
      else if ((long_options[local_58].has_arg == 0) && (current_argv_len != 0)) {
        if ((opterr != 0) && (*options != ':')) {
          warnx("option doesn\'t take an argument -- %.*s",_match & 0xffffffff,__s);
        }
        if (long_options[local_58].flag == (int *)0x0) {
          optopt = long_options[local_58].val;
        }
        else {
          optopt = 0;
        }
        nargv_local._4_4_ = 0x3f;
        if (*options == ':') {
          nargv_local._4_4_ = 0x3a;
        }
      }
      else {
        if ((long_options[local_58].has_arg == 1) || (long_options[local_58].has_arg == 2)) {
          if (current_argv_len == 0) {
            if (long_options[local_58].has_arg == 1) {
              optarg = nargv[optind];
              optind = optind + 1;
            }
          }
          else {
            optarg = (char *)current_argv_len;
          }
        }
        if ((long_options[local_58].has_arg == 1) && (optarg == (char *)0x0)) {
          if ((opterr != 0) && (*options != ':')) {
            warnx("option requires an argument -- %s",__s);
          }
          if (long_options[local_58].flag == (int *)0x0) {
            optopt = long_options[local_58].val;
          }
          else {
            optopt = 0;
          }
          optind = optind + -1;
          nargv_local._4_4_ = 0x3f;
          if (*options == ':') {
            nargv_local._4_4_ = 0x3a;
          }
        }
        else {
          if (idx != (int *)0x0) {
            *idx = local_58;
          }
          if (long_options[local_58].flag == (int *)0x0) {
            nargv_local._4_4_ = long_options[local_58].val;
          }
          else {
            *long_options[local_58].flag = long_options[local_58].val;
            nargv_local._4_4_ = 0;
          }
        }
      }
      return nargv_local._4_4_;
    }
    iVar1 = strncmp(__s,long_options[local_54].name,_match);
    if (iVar1 == 0) {
      sVar3 = strlen(long_options[local_54].name);
      if (sVar3 == _match) {
        local_58 = local_54;
        goto LAB_0010aa9d;
      }
      if ((short_too == 0) || (_match != 1)) {
        if (local_58 != -1) {
          if ((opterr != 0) && (*options != ':')) {
            warnx("ambiguous option -- %.*s",_match & 0xffffffff,__s);
          }
          optopt = 0;
          return 0x3f;
        }
        local_58 = local_54;
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

static int
parse_long_options(char * const * nargv, const char * options,
				   const struct option * long_options, int * idx, int short_too) {
	char * current_argv, *has_equal;
	size_t current_argv_len;
	int i, match;

	current_argv = place;
	match = -1;

	optind++;

	if ((has_equal = strchr(current_argv, '=')) != NULL) {
		/* argument found (--option=arg) */
		current_argv_len = has_equal - current_argv;
		has_equal++;
	} else {
		current_argv_len = strlen(current_argv);
	}

	for (i = 0; long_options[i].name; i++) {
		/* find matching long option */
		if (strncmp(current_argv, long_options[i].name,
					current_argv_len)) {
			continue;
		}

		if (strlen(long_options[i].name) == current_argv_len) {
			/* exact match */
			match = i;
			break;
		}

		/*
		 * If this is a known short option, don't allow
		 * a partial match of a single character.
		 */
		if (short_too && current_argv_len == 1) {
			continue;
		}

		if (match == -1) {	/* partial match */
			match = i;
		} else {
			/* ambiguous abbreviation */
			if (PRINT_ERROR)
				warnx(ambig, (int)current_argv_len,
					  current_argv);

			optopt = 0;
			return (BADCH);
		}
	}

	if (match != -1) {		/* option found */
		if (long_options[match].has_arg == no_argument
				&& has_equal) {
			if (PRINT_ERROR)
				warnx(noarg, (int)current_argv_len,
					  current_argv);

			/*
			 * XXX: GNU sets optopt to val regardless of flag
			 */
			if (long_options[match].flag == NULL) {
				optopt = long_options[match].val;
			} else {
				optopt = 0;
			}

			return (BADARG);
		}

		if (long_options[match].has_arg == required_argument ||
				long_options[match].has_arg == optional_argument) {
			if (has_equal) {
				optarg = has_equal;
			} else if (long_options[match].has_arg ==
					   required_argument) {
				/*
				 * optional argument doesn't use next nargv
				 */
				optarg = nargv[optind++];
			}
		}

		if ((long_options[match].has_arg == required_argument)
				&& (optarg == NULL)) {
			/*
			 * Missing argument; leading ':' indicates no error
			 * should be generated.
			 */
			if (PRINT_ERROR)
				warnx(recargstring,
					  current_argv);

			/*
			 * XXX: GNU sets optopt to val regardless of flag
			 */
			if (long_options[match].flag == NULL) {
				optopt = long_options[match].val;
			} else {
				optopt = 0;
			}

			--optind;
			return (BADARG);
		}
	} else {			/* unknown option */
		if (short_too) {
			--optind;
			return (-1);
		}

		if (PRINT_ERROR) {
			warnx(illoptstring, current_argv);
		}

		optopt = 0;
		return (BADCH);
	}

	if (idx) {
		*idx = match;
	}

	if (long_options[match].flag) {
		*long_options[match].flag = long_options[match].val;
		return (0);
	} else {
		return (long_options[match].val);
	}
}